

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O2

void __thiscall optimization::const_merge::Env::Env(Env *this,MirFunction *func)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  int i;
  int idx;
  ulong uVar7;
  VarId local_60;
  VarId local_50;
  VarId local_40;
  
  this->func = func;
  (this->usepoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usepoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->usepoints)._M_t._M_impl.super__Rb_tree_header;
  (this->usepoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usepoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usepoints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var5 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    for (uVar7 = 0; p_Var2 = p_Var5[3]._M_parent,
        uVar7 < (ulong)((long)p_Var5[3]._M_left - (long)p_Var2 >> 3); uVar7 = uVar7 + 1) {
      plVar6 = *(long **)(&p_Var2->_M_color + uVar7 * 2);
      iVar3 = (**(code **)(*plVar6 + 8))(plVar6);
      idx = (int)uVar7;
      if (iVar3 == 0) {
        if ((char)plVar6[6] == '\x01') {
          pvVar4 = std::get<1ul,int,mir::inst::VarId>
                             ((variant<int,_mir::inst::VarId> *)(plVar6 + 4));
          local_40.id = pvVar4->id;
          local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          add_usepoint(this,&local_40,p_Var5[1]._M_color,idx);
        }
      }
      else {
        iVar3 = (**(code **)(**(long **)(&p_Var2->_M_color + uVar7 * 2) + 8))();
        if (iVar3 == 1) {
          if ((undefined **)*plVar6 != &PTR_display_001db058) {
            plVar6 = (long *)0x0;
          }
          if ((char)plVar6[6] == '\x01') {
            pvVar4 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(plVar6 + 4));
            local_50.id = pvVar4->id;
            local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
            add_usepoint(this,&local_50,p_Var5[1]._M_color,idx);
          }
          if ((char)plVar6[10] == '\x01') {
            pvVar4 = std::get<1ul,int,mir::inst::VarId>
                               ((variant<int,_mir::inst::VarId> *)(plVar6 + 8));
            local_60.id = pvVar4->id;
            local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
            add_usepoint(this,&local_60,p_Var5[1]._M_color,idx);
          }
        }
      }
    }
  }
  return;
}

Assistant:

Env(mir::inst::MirFunction& func) : func(func) {
    for (auto& blkpair : func.basic_blks) {
      for (int i = 0; i < blkpair.second.inst.size(); i++) {
        auto& inst = blkpair.second.inst[i];
        auto& is = *inst;
        if (inst->inst_kind() == mir::inst::InstKind::Assign) {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&is);
          if (assignInst->src.index() == 1) {
            auto srcid = std::get<mir::inst::VarId>(assignInst->src);
            add_usepoint(srcid, blkpair.first, i);
          }
        } else if (inst->inst_kind() == mir::inst::InstKind::Op) {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&is);
          if (opInst->lhs.index() == 1) {
            auto var = std::get<mir::inst::VarId>(opInst->lhs);
            add_usepoint(var, blkpair.first, i);
          }
          if (opInst->rhs.index() == 1) {
            auto var = std::get<mir::inst::VarId>(opInst->rhs);
            add_usepoint(var, blkpair.first, i);
          }
        }
      }
    }
  }